

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> * __thiscall
GraphBuilder::getLocks
          (set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>
           *__return_storage_ptr__,GraphBuilder *this)

{
  _Rb_tree_header *p_Var1;
  _Hash_node_base *p_Var2;
  value_type iterator;
  LockNode *pLStack_20;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->llvmToLocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      pLStack_20 = (LockNode *)p_Var2[2]._M_nxt;
      std::
      _Rb_tree<LockNode*,LockNode*,std::_Identity<LockNode*>,std::less<LockNode*>,std::allocator<LockNode*>>
      ::_M_insert_unique<LockNode*const&>
                ((_Rb_tree<LockNode*,LockNode*,std::_Identity<LockNode*>,std::less<LockNode*>,std::allocator<LockNode*>>
                  *)__return_storage_ptr__,&pLStack_20);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<LockNode *> GraphBuilder::getLocks() const {
    std::set<LockNode *> locks;
    for (auto iterator : llvmToLocks_) {
        locks.insert(iterator.second);
    }
    return locks;
}